

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int print_automorphism_ntk
              (FILE *f,int n,int *gamma,int nsupp,int *support,char *marks,Abc_Ntk_t *pNtk)

{
  int v;
  int v_00;
  char *pcVar1;
  ulong uVar2;
  
  if (nsupp < 1) {
    fputc(10,(FILE *)f);
  }
  else {
    uVar2 = 0;
    do {
      v = support[uVar2];
      if (marks[v] == '\0') {
        marks[v] = '\x01';
        pcVar1 = getVertexName(pNtk,v);
        fprintf((FILE *)f,"(%s",pcVar1);
        for (v_00 = gamma[v]; v_00 != v; v_00 = gamma[v_00]) {
          marks[v_00] = '\x01';
          pcVar1 = getVertexName(pNtk,v_00);
          fprintf((FILE *)f," %s",pcVar1);
        }
        fputc(0x29,(FILE *)f);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)nsupp);
    fputc(10,(FILE *)f);
    if (0 < nsupp) {
      uVar2 = 0;
      do {
        marks[support[uVar2]] = '\0';
        uVar2 = uVar2 + 1;
      } while ((uint)nsupp != uVar2);
    }
  }
  return 1;
}

Assistant:

static int
print_automorphism_ntk(FILE *f, int n, const int *gamma, int nsupp, const int *support, char * marks, Abc_Ntk_t * pNtk)
{
    int i, j, k;    

    /* We presume support is already sorted */
    for (i = 0; i < nsupp; ++i) {
        k = support[i];

        /* Skip elements already seen */
        if (marks[k]) continue;

        /* Start an orbit */
        marks[k] = 1;
        fprintf(f, "(%s", getVertexName(pNtk, k));

        /* Mark and notify elements in this orbit */
        for (j = gamma[k]; j != k; j = gamma[j]) {
            marks[j] = 1;
            fprintf(f, " %s", getVertexName(pNtk, j));
        }

        /* Finish off the orbit */
        fprintf(f, ")");
    }
    fprintf(f, "\n");

    /* Clean up after ourselves */
    for (i = 0; i < nsupp; ++i) {
        marks[support[i]] = 0;
    }

    return 1;
}